

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void gl4cts::GLSL420Pack::Utils::program::printShaderSource
               (shaderSource *source,MessageBuilder *log)

{
  ostringstream *poVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  char *__s;
  string line;
  
  poVar1 = &log->m_str;
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"Shader source.");
  uVar3 = 0;
  while (uVar3 < (ulong)(((long)(source->m_parts).
                                super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(source->m_parts).
                               super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\nLine||Part: ");
    iVar2 = (int)uVar3;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"/");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    if (source->m_use_lengths == true) {
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," Length: ");
      tcu::MessageBuilder::operator<<
                (log,&(source->m_parts).
                      super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar3].m_length);
    }
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    __s = (source->m_parts).
          super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar3].m_code._M_dataplus._M_p;
    while (uVar3 = (ulong)(iVar2 + 1), __s != (char *)0x0) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      pcVar4 = strchr(__s,10);
      if (pcVar4 == (char *)0x0) {
        std::__cxx11::string::assign((char *)&line);
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar4 = pcVar4 + 1;
        std::__cxx11::string::assign((char *)&line,(ulong)__s);
      }
      if (*__s != '\0') {
        *(undefined8 *)
         ((log->m_str).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3] +
          0x10 + (long)&(log->m_str).super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream) = 4;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"||");
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,(string *)&line)
        ;
      }
      std::__cxx11::string::~string((string *)&line);
      __s = pcVar4;
    }
  }
  return;
}

Assistant:

void Utils::program::printShaderSource(const shaderSource& source, tcu::MessageBuilder& log)
{
	GLuint line_number = 0;

	log << "Shader source.";

	for (GLuint i = 0; i < source.m_parts.size(); ++i)
	{
		log << "\nLine||Part: " << (i + 1) << "/" << source.m_parts.size();

		if (true == source.m_use_lengths)
		{
			log << " Length: " << source.m_parts[i].m_length;
		}

		log << "\n";

		const GLchar* part = source.m_parts[i].m_code.c_str();

		while (0 != part)
		{
			std::string   line;
			const GLchar* next_line = strchr(part, '\n');

			if (0 != next_line)
			{
				next_line += 1;
				line.assign(part, next_line - part);
			}
			else
			{
				line = part;
			}

			if (0 != *part)
			{
				log << std::setw(4) << line_number << "||" << line;
			}

			part = next_line;
			line_number += 1;
		}
	}
}